

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O1

mk_plugin * mk_plugin_cap(char cap,mk_server *server)

{
  mk_list *__mptr;
  mk_list *pmVar1;
  
  pmVar1 = (server->plugins).next;
  while( true ) {
    if (pmVar1 == &server->plugins) {
      return (mk_plugin *)0x0;
    }
    if ((*(byte *)((long)&pmVar1[-6].next + 4) & cap) != 0) break;
    pmVar1 = pmVar1->next;
  }
  return (mk_plugin *)&pmVar1[-8].next;
}

Assistant:

struct mk_plugin *mk_plugin_cap(char cap, struct mk_server *server)
{
    struct mk_list *head;
    struct mk_plugin *plugin;

    mk_list_foreach(head, &server->plugins) {
        plugin = mk_list_entry(head, struct mk_plugin, _head);
        if (plugin->capabilities & cap) {
            return plugin;
        }
    }

    return NULL;
}